

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void display_options(nh_bool change_birth_opt)

{
  wchar_t wVar1;
  nh_menuitem *__ptr;
  nh_option_desc *pnVar2;
  long lVar3;
  wchar_t listid;
  nh_menuitem *_item_;
  long lVar4;
  undefined7 in_register_00000039;
  nh_bool read_only;
  wchar_t size;
  wchar_t local_4c;
  nh_menuitem *items;
  undefined4 local_3c;
  nh_option_desc *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000039,change_birth_opt);
  local_38 = (nh_option_desc *)nh_get_options(2);
  size = L'\n';
  __ptr = (nh_menuitem *)malloc(0xa78);
  items = __ptr;
  do {
    if ((char)local_3c == '\0') {
      pnVar2 = (nh_option_desc *)nh_get_options(1);
      lVar3 = (long)size;
      if (lVar3 < 1) {
        size = size * 2;
        __ptr = (nh_menuitem *)realloc(__ptr,lVar3 * 0x218);
        items = __ptr;
      }
      __ptr->id = 0;
      __ptr->role = MI_HEADING;
      __ptr->accel = '\0';
      __ptr->group_accel = '\0';
      __ptr->selected = '\0';
      builtin_strncpy(__ptr->caption,"Game options:",0xe);
      local_4c = L'\x01';
      menu_add_options(&items,&size,&local_4c,L'\x03',local_38,'\0');
      wVar1 = local_4c;
      lVar4 = (long)local_4c;
      lVar3 = (long)size;
      if (size <= local_4c) {
        size = size * 2;
        items = (nh_menuitem *)realloc(items,lVar3 * 0x218);
      }
      items[lVar4].id = 0;
      items[lVar4].role = MI_HEADING;
      items[lVar4].accel = '\0';
      items[lVar4].group_accel = '\0';
      items[lVar4].selected = '\0';
      builtin_strncpy(items[lVar4].caption,"Birth options fo",0x10);
      builtin_strncpy(items[lVar4].caption + 0xd," for this game:",0x10);
      listid = L'\x01';
      read_only = '\x01';
    }
    else {
      pnVar2 = (nh_option_desc *)nh_get_options(0);
      lVar3 = (long)size;
      if (lVar3 < 1) {
        size = size * 2;
        __ptr = (nh_menuitem *)realloc(__ptr,lVar3 * 0x218);
        items = __ptr;
      }
      __ptr->id = 0;
      __ptr->role = MI_HEADING;
      __ptr->accel = '\0';
      __ptr->group_accel = '\0';
      __ptr->selected = '\0';
      builtin_strncpy(__ptr->caption,"Birth options:",0xf);
      local_4c = L'\x01';
      menu_add_options(&items,&size,&local_4c,L'\x02',pnVar2,'\0');
      wVar1 = local_4c;
      lVar4 = (long)local_4c;
      lVar3 = (long)size;
      if (size <= local_4c) {
        size = size * 2;
        items = (nh_menuitem *)realloc(items,lVar3 * 0x218);
      }
      items[lVar4].id = 0;
      items[lVar4].role = MI_HEADING;
      items[lVar4].accel = '\0';
      items[lVar4].group_accel = '\0';
      items[lVar4].selected = '\0';
      builtin_strncpy(items[lVar4].caption,"Game opt",8);
      builtin_strncpy(items[lVar4].caption + 6,"ptions:",8);
      listid = L'\x03';
      read_only = '\0';
      pnVar2 = local_38;
    }
    local_4c = wVar1 + L'\x01';
    menu_add_options(&items,&size,&local_4c,listid,pnVar2,read_only);
    wVar1 = local_4c;
    lVar4 = (long)local_4c;
    lVar3 = (long)size;
    if (size <= local_4c) {
      size = size * 2;
      items = (nh_menuitem *)realloc(items,lVar3 * 0x218);
    }
    items[lVar4].id = 0;
    items[lVar4].role = MI_HEADING;
    items[lVar4].accel = '\0';
    items[lVar4].group_accel = '\0';
    items[lVar4].selected = '\0';
    builtin_strncpy(items[lVar4].caption,"Interface option",0x10);
    builtin_strncpy(items[lVar4].caption + 0xf,"ns:",4);
    local_4c = wVar1 + L'\x01';
    menu_add_options(&items,&size,&local_4c,L'\x04',curses_options,'\0');
    __ptr = items;
    wVar1 = curses_display_menu_core
                      ((nh_menuitem_conflict *)items,local_4c,"Set what options?",L'\x01',
                       (wchar_t *)0x0,L'\0',L'\0',L'\xffffffff',L'\xffffffff',get_option_value,'\0')
    ;
  } while (L'\0' < wVar1);
  free(__ptr);
  write_config();
  return;
}

Assistant:

void display_options(nh_bool change_birth_opt)
{
    struct nh_menuitem *items;
    int icount, size;
    struct nh_option_desc *nhoptions = nh_get_options(GAME_OPTIONS);
    struct nh_option_desc *birthoptions = NULL;
    int n;
    
    size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    do {
	icount = 0;
	if (!change_birth_opt) {
	    birthoptions = nh_get_options(ACTIVE_BIRTH_OPTIONS);
	    /* add general game options */
	    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, GAME_OPTS, nhoptions,
				FALSE);
	    
	    /* add or display birth options */
	    add_menu_txt(items, size, icount, "Birth options for this game:",
			    MI_HEADING);
	    menu_add_options(&items, &size, &icount, ACT_BIRTH_OPTS,
				birthoptions, TRUE);
	} else {
	    birthoptions = nh_get_options(CURRENT_BIRTH_OPTIONS);
	    /* add or display birth options */
	    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, CUR_BIRTH_OPTS,
				birthoptions, FALSE);
	    
	    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, GAME_OPTS, nhoptions, FALSE);
	}
	
	/* add UI specific options */
	add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
	menu_add_options(&items, &size, &icount, UI_OPTS, curses_options, FALSE);
	
	n = curses_display_menu_core(items, icount, "Set what options?", PICK_ONE,
				     NULL, 0, 0, -1, -1, get_option_value, FALSE);
    } while (n > 0);
    free(items);
    
    write_config();
}